

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O2

int __thiscall uv11::listen(uv11 *this,int __fd,int __n)

{
  int s;
  undefined4 in_register_00000014;
  error_code eVar1;
  
  std::function<void_(uv11::Stream_&,_std::error_code)>::operator=
            ((function<void_(uv11::Stream_&,_std::error_code)> *)(this + 0x78),
             (function<void_(uv11::Stream_&,_std::error_code)> *)CONCAT44(in_register_00000014,__n))
  ;
  s = uv_listen(*(undefined8 *)(this + 0x98),__fd,listen::anon_class_1_0_00000001::__invoke);
  if (s != 0) {
    std::function<void_(uv11::Stream_&,_std::error_code)>::operator=
              ((function<void_(uv11::Stream_&,_std::error_code)> *)(this + 0x78),(nullptr_t)0x0);
  }
  eVar1 = make_error(s);
  return eVar1._M_value;
}

Assistant:

Error uv11::listen(Stream& stream, int backlog, ConnectionCb const& connection_cb) {
    stream.on_connection = connection_cb;

    int s = ::uv_listen(
        &stream.GetStream(),
        backlog,
        [](uv_stream_t* server, int status) {
            Stream* strm = reinterpret_cast<Stream*>(server->data);
            return strm->on_connection(*strm, make_error(status));
        }
    );

    if (s) stream.on_connection = nullptr;

    return make_error(s);
}